

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O3

int MAFSA_automaton_val_to_int(MAFSA_letter *l,size_t sz_l,MAFSA_letter delim,int *out)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar2 = (int)sz_l - 1;
  if ((int)uVar2 < 0) {
    iVar1 = 0;
  }
  else {
    uVar3 = (ulong)uVar2;
    iVar1 = 0;
    do {
      iVar1 = iVar1 * (uint)delim + (uint)l[uVar3];
      bVar4 = uVar3 != 0;
      uVar3 = uVar3 - 1;
    } while (bVar4);
  }
  *out = iVar1;
  return 0;
}

Assistant:

extern int MAFSA_automaton_val_to_int(const MAFSA_letter *l,
    size_t sz_l, MAFSA_letter delim, int *out)
{
    int i;
    int count;

    for (i = sz_l - 1, count = 0; i >= 0; --i)
    {
        count *= delim;
        count += l[i];
    }

    out[0] = count;

    return 0;
}